

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.h
# Opt level: O2

void __thiscall LParserException::LParserException(LParserException *this,string *detail)

{
  *(undefined ***)this = &PTR__LParserException_001225a0;
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  (this->detail)._M_string_length = 0;
  (this->detail).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->detail,(string *)detail);
  return;
}

Assistant:

explicit LParserException(std::string &&detail) {
        this->detail = std::move(detail);
    }